

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

BlindFactor *
cfd::core::ConfidentialTransaction::CalculateAssetEntropy
          (BlindFactor *__return_storage_ptr__,Txid *txid,uint32_t vout,ByteData256 *contract_hash)

{
  pointer *this;
  uint32_t index;
  uchar *txhash;
  size_type txhash_len;
  uchar *contract_hash_00;
  size_type contract_hash_len;
  uchar *bytes_out;
  size_type len;
  CfdException *this_00;
  ByteData256 local_108;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8;
  CfdSourceLocation local_c8;
  int local_b0;
  allocator<unsigned_char> local_a9;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entropy;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *contract_hash_byte;
  ByteData local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *txid_byte;
  ByteData256 *contract_hash_local;
  Txid *pTStack_18;
  uint32_t vout_local;
  Txid *txid_local;
  
  txid_byte = &contract_hash->data_;
  contract_hash_local._4_4_ = vout;
  pTStack_18 = txid;
  txid_local = (Txid *)__return_storage_ptr__;
  Txid::GetData(&local_60,txid);
  ByteData::GetBytes(&local_48,&local_60);
  ByteData::~ByteData(&local_60);
  local_30 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48;
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)txid_byte);
  this = &entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  ::std::allocator<unsigned_char>::allocator(&local_a9);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,0x20,&local_a9);
  ::std::allocator<unsigned_char>::~allocator(&local_a9);
  txhash = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_30);
  txhash_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_30);
  index = contract_hash_local._4_4_;
  contract_hash_00 =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  contract_hash_len =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  local_b0 = wally_tx_elements_issuance_generate_entropy
                       (txhash,txhash_len,index,contract_hash_00,contract_hash_len,bytes_out,len);
  if (local_b0 != 0) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x81d;
    local_c8.funcname = "CalculateAssetEntropy";
    logger::warn<int&>(&local_c8,"wally_tx_elements_issuance_generate_entropy NG[{}].",&local_b0);
    local_ea = 1;
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_e8,"entropy generate error.",&local_e9);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_e8);
    local_ea = 0;
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData256::ByteData256(&local_108,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret)
  ;
  BlindFactor::BlindFactor(__return_storage_ptr__,&local_108);
  ByteData256::~ByteData256(&local_108);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

BlindFactor ConfidentialTransaction::CalculateAssetEntropy(
    const Txid &txid, const uint32_t vout, const ByteData256 &contract_hash) {
  const std::vector<uint8_t> &txid_byte = txid.GetData().GetBytes();
  const std::vector<uint8_t> &contract_hash_byte = contract_hash.GetBytes();
  std::vector<uint8_t> entropy(kEntropySize);

  int ret = wally_tx_elements_issuance_generate_entropy(
      txid_byte.data(), txid_byte.size(), vout, contract_hash_byte.data(),
      contract_hash_byte.size(), entropy.data(), entropy.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_elements_issuance_generate_entropy NG[{}].",
        ret);
    throw CfdException(kCfdIllegalStateError, "entropy generate error.");
  }

  return BlindFactor(ByteData256(entropy));
}